

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O1

void __thiscall
TPZEqnArray<std::complex<long_double>_>::Write
          (TPZEqnArray<std::complex<long_double>_> *this,FILE *outputfile)

{
  long *plVar1;
  int aux;
  int local_1c;
  
  fwrite(&this->fNumEq,4,1,(FILE *)outputfile);
  fwrite(&this->fLastTerm,4,1,(FILE *)outputfile);
  local_1c = (int)(this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements;
  if (local_1c == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "void TPZEqnArray<std::complex<long double>>::Write(FILE *) [TVar = std::complex<long double>]"
               ,0x5d);
    plVar1 = (long *)std::ostream::operator<<(&std::cout,0xc9);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  fwrite(&local_1c,4,1,(FILE *)outputfile);
  fwrite((this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,4,(long)local_1c,
         (FILE *)outputfile);
  local_1c = (int)(this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fNElements;
  if (local_1c == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "void TPZEqnArray<std::complex<long double>>::Write(FILE *) [TVar = std::complex<long double>]"
               ,0x5d);
    plVar1 = (long *)std::ostream::operator<<(&std::cout,0xd2);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
  }
  fwrite(&local_1c,4,1,(FILE *)outputfile);
  fwrite((this->fEqNumber).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore,4,(long)local_1c,
         (FILE *)outputfile);
  local_1c = (int)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fNElements;
  fwrite(&local_1c,4,1,(FILE *)outputfile);
  fwrite((this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore,4,(long)local_1c,
         (FILE *)outputfile);
  local_1c = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                  super_TPZVec<std::complex<long_double>_>.fNElements;
  fwrite(&local_1c,4,1,(FILE *)outputfile);
  fwrite((this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
         super_TPZVec<std::complex<long_double>_>.fStore,8,(long)local_1c,(FILE *)outputfile);
  return;
}

Assistant:

void TPZEqnArray<TVar>::Write(FILE * outputfile){
	/** Number of equations */
	fwrite(&fNumEq,sizeof(int),1,outputfile);
	//cout << ftell(outputfile) << endl;
	/** Last term added*/
	fwrite(&fLastTerm,sizeof(int),1,outputfile);
	//cout << ftell(outputfile) << endl;
	/** TPZStack fEqStart data */
	int aux = fEqStart.NElements();
	if(aux == 0) 
	{
		std::cout << __PRETTY_FUNCTION__ << __LINE__ << std::endl;
	}
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqStart[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fEqNumber data */
	aux = fEqNumber.NElements();
	if(aux == 0) 
	{
		std::cout << __PRETTY_FUNCTION__ << __LINE__ << std::endl;
	}
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqNumber[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fIndex data */
	aux = fIndex.NElements();
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fIndex[0],sizeof(int), aux ,outputfile);
	
	/** TPZStack fEqValues data */
	aux = fEqValues.NElements();
	fwrite(&aux,sizeof(int),1,outputfile);
	fwrite(&fEqValues[0],sizeof(REAL), aux ,outputfile);
}